

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ImmediatePromiseNode<unsigned_long>::ImmediatePromiseNode
          (ImmediatePromiseNode<unsigned_long> *this,ExceptionOr<unsigned_long> *result)

{
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_006706e0;
  ExceptionOr<unsigned_long>::ExceptionOr(&this->result,result);
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}